

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<prometheus::(anonymous_namespace)::CheckLabelNameTest_trailing_invalid_label_name_Test>
::CreateTest(ParameterizedTestFactory<prometheus::(anonymous_namespace)::CheckLabelNameTest_trailing_invalid_label_name_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<prometheus::MetricType>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_001aed00;
  this_00[1]._vptr_Test =
       (_func_int **)&PTR__CheckLabelNameTest_trailing_invalid_label_name_Test_001aed40;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }